

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::RefInst::display(RefInst *this,ostream *o)

{
  __index_type _Var1;
  ostream *poVar2;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar3;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::operator<<(o," = &");
  _Var1 = (this->val).
          super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>._M_index
  ;
  pvVar3 = &this->val;
  if (_Var1 == '\x01') {
    poVar2 = std::operator<<(o,"@");
    std::operator<<(poVar2,(string *)pvVar3);
    return;
  }
  if (_Var1 == '\0') {
    (*(code *)**(undefined8 **)
                &(pvVar3->
                 super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>)
              (pvVar3,o);
    return;
  }
  return;
}

Assistant:

void RefInst::display(std::ostream& o) const {
  o << dest << " = &";
  if (auto x = std::get_if<VarId>(&val)) {
    o << *x;
  } else if (auto x = std::get_if<std::string>(&val)) {
    o << "@" << *x;
  }
}